

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZGenGrid2D.cpp
# Opt level: O0

bool __thiscall
TPZGenGrid2D::ReadAndMergeGeoMesh
          (TPZGenGrid2D *this,TPZGeoMesh *gridinitial,TPZGeoMesh *tomerge,int matid)

{
  byte bVar1;
  bool bVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  undefined4 uVar6;
  uint uVar7;
  int64_t iVar8;
  TPZGeoNode *pTVar9;
  TPZGeoEl **ppTVar10;
  long lVar11;
  undefined4 extraout_var;
  undefined4 in_ECX;
  TPZGeoMesh *in_RSI;
  long *in_RDI;
  REAL RVar12;
  int eltype;
  int64_t index_1;
  int64_t ngelnodes;
  TPZVec<long> nos;
  int64_t nelmerge;
  int p_1;
  int64_t idold;
  int64_t idnew;
  int p;
  int64_t oldid;
  int64_t index;
  TPZGeoEl *gel;
  TPZGeoNode *nodetomerge;
  TPZVec<double> coordtomerge;
  TPZVec<double> coordinitial;
  int64_t nnodesinitial;
  int64_t nnodestomerge;
  int64_t k;
  int64_t j;
  int64_t i;
  TPZGeoMesh *gridtomerge;
  TPZGeoMesh gtomerge;
  TPZGeoMesh *in_stack_fffffffffffffaa0;
  undefined4 in_stack_fffffffffffffaa8;
  int in_stack_fffffffffffffaac;
  TPZGeoNode *in_stack_fffffffffffffab0;
  TPZGeoMesh *pTVar13;
  undefined4 in_stack_fffffffffffffab8;
  uint in_stack_fffffffffffffabc;
  TPZChunkVector<TPZGeoEl_*,_10> *in_stack_fffffffffffffac0;
  TPZVec<double> *in_stack_fffffffffffffac8;
  undefined4 in_stack_fffffffffffffad0;
  undefined4 in_stack_fffffffffffffad4;
  TPZGeoMesh *in_stack_fffffffffffffad8;
  TPZGeoMesh *in_stack_fffffffffffffae0;
  TPZGeoMesh *in_stack_fffffffffffffb30;
  undefined1 local_3d8 [8];
  long local_3d0;
  TPZVec<long> local_3c8;
  long local_3a8;
  int local_39c;
  long local_398;
  long local_390;
  int local_384;
  long local_380;
  long local_378;
  TPZGeoEl *local_370;
  TPZGeoMesh *local_368;
  undefined8 local_360;
  undefined8 local_338;
  ulong local_310;
  int64_t local_2f8;
  long local_2f0;
  ulong local_2e8;
  long local_2e0;
  TPZGeoMesh *local_2d8;
  TPZGeoMesh *in_stack_fffffffffffffdc0;
  TPZGeoNode *in_stack_fffffffffffffeb8;
  TPZGeoNode *in_stack_fffffffffffffec0;
  bool local_1;
  
  sVar3 = (**(code **)(*in_RDI + 0x10))(in_RDI,in_RSI,in_ECX);
  if (sVar3 == 0) {
    iVar8 = TPZGeoMesh::NNodes((TPZGeoMesh *)0x1f2054b);
    if ((iVar8 == 0) && (iVar8 = TPZGeoMesh::NElements((TPZGeoMesh *)0x1f2055e), iVar8 == 0)) {
      local_1 = true;
    }
    else {
      TPZGeoMesh::TPZGeoMesh(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
      local_2d8 = (TPZGeoMesh *)&stack0xfffffffffffffd30;
      local_2f8 = TPZGeoMesh::NNodes((TPZGeoMesh *)0x1f205ab);
      local_310 = TPZGeoMesh::NNodes((TPZGeoMesh *)0x1f205d2);
      local_338 = 0;
      TPZVec<double>::TPZVec
                ((TPZVec<double> *)in_stack_fffffffffffffab0,
                 CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
                 (double *)in_stack_fffffffffffffaa0);
      local_360 = 0;
      TPZVec<double>::TPZVec
                ((TPZVec<double> *)in_stack_fffffffffffffab0,
                 CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
                 (double *)in_stack_fffffffffffffaa0);
      for (local_2e0 = 0; local_2e0 < local_2f8; local_2e0 = local_2e0 + 1) {
        TPZGeoMesh::NodeVec(local_2d8);
        local_368 = (TPZGeoMesh *)
                    TPZChunkVector<TPZGeoNode,_10>::operator[]
                              ((TPZChunkVector<TPZGeoNode,_10> *)in_stack_fffffffffffffac0,
                               CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
        if (local_368 != (TPZGeoMesh *)0x0) {
          TPZGeoNode::GetCoordinates
                    (in_stack_fffffffffffffab0,
                     (TPZVec<double> *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8)
                    );
          for (local_2e8 = 0; (long)local_2e8 < (long)local_310; local_2e8 = local_2e8 + 1) {
            TPZGeoMesh::NodeVec(in_RSI);
            TPZChunkVector<TPZGeoNode,_10>::operator[]
                      ((TPZChunkVector<TPZGeoNode,_10> *)in_stack_fffffffffffffac0,
                       CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
            TPZGeoNode::GetCoordinates
                      (in_stack_fffffffffffffab0,
                       (TPZVec<double> *)
                       CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
            RVar12 = Distance((TPZVec<double> *)
                              CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                              in_stack_fffffffffffffac8);
            bVar2 = IsZero(RVar12);
            if (bVar2) {
              TPZGeoNode::Id((TPZGeoNode *)local_368);
              TPZGeoNode::SetCoord
                        (in_stack_fffffffffffffab0,in_stack_fffffffffffffaac,
                         (REAL)in_stack_fffffffffffffaa0);
              pTVar13 = local_368;
              TPZGeoMesh::NodeVec(in_RSI);
              pTVar9 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                                 ((TPZChunkVector<TPZGeoNode,_10> *)in_stack_fffffffffffffac0,
                                  CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
              iVar4 = TPZGeoNode::Id(pTVar9);
              TPZGeoNode::SetNodeId((TPZGeoNode *)pTVar13,iVar4);
              break;
            }
          }
          if (local_2e8 == local_310) {
            TPZGeoMesh::NodeVec(in_RSI);
            iVar4 = TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement
                              ((TPZAdmChunkVector<TPZGeoNode,_10> *)
                               CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
            local_378 = (long)iVar4;
            TPZGeoMesh::NodeVec(in_RSI);
            TPZChunkVector<TPZGeoNode,_10>::operator[]
                      ((TPZChunkVector<TPZGeoNode,_10> *)in_stack_fffffffffffffac0,
                       CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
            TPZGeoNode::Initialize
                      (in_stack_fffffffffffffab0,
                       (TPZVec<double> *)
                       CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
                       in_stack_fffffffffffffaa0);
            TPZGeoMesh::NodeVec(in_RSI);
            pTVar9 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                               ((TPZChunkVector<TPZGeoNode,_10> *)in_stack_fffffffffffffac0,
                                CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
            iVar4 = TPZGeoNode::Id(pTVar9);
            local_378 = (long)iVar4;
            iVar4 = TPZGeoNode::Id((TPZGeoNode *)local_368);
            local_380 = (long)iVar4;
            for (local_2f0 = 0; lVar11 = local_2f0,
                iVar8 = TPZGeoMesh::NElements((TPZGeoMesh *)0x1f209eb), lVar11 < iVar8;
                local_2f0 = local_2f0 + 1) {
              TPZGeoMesh::ElementVec(local_2d8);
              ppTVar10 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                                   (in_stack_fffffffffffffac0,
                                    CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
              local_370 = *ppTVar10;
              if (local_370 != (TPZGeoEl *)0x0) {
                for (local_384 = 0; iVar4 = local_384,
                    iVar5 = (**(code **)(*(long *)local_370 + 0x90))(), iVar4 < iVar5;
                    local_384 = local_384 + 1) {
                  lVar11 = (**(code **)(*(long *)local_370 + 0xa8))(local_370,local_384);
                  if (lVar11 == local_380) {
                    (**(code **)(*(long *)local_370 + 0x178))(local_370,local_384,local_378);
                  }
                }
              }
            }
            TPZGeoNode::SetNodeId((TPZGeoNode *)local_368,-1);
          }
        }
      }
      for (local_2e0 = 0; local_2e0 < local_2f8; local_2e0 = local_2e0 + 1) {
        TPZGeoMesh::NodeVec(local_2d8);
        in_stack_fffffffffffffb30 =
             (TPZGeoMesh *)
             TPZChunkVector<TPZGeoNode,_10>::operator[]
                       ((TPZChunkVector<TPZGeoNode,_10> *)in_stack_fffffffffffffac0,
                        CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
        local_368 = in_stack_fffffffffffffb30;
        if ((in_stack_fffffffffffffb30 != (TPZGeoMesh *)0x0) &&
           (iVar4 = TPZGeoNode::Id((TPZGeoNode *)in_stack_fffffffffffffb30), iVar4 != -1)) {
          iVar4 = TPZGeoNode::Id((TPZGeoNode *)local_368);
          local_390 = (long)iVar4;
          RVar12 = TPZGeoNode::Coord((TPZGeoNode *)
                                     CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
                                     (int)((ulong)in_stack_fffffffffffffaa0 >> 0x20));
          local_398 = (long)RVar12;
          for (local_2f0 = 0; lVar11 = local_2f0,
              iVar8 = TPZGeoMesh::NElements((TPZGeoMesh *)0x1f20c88), lVar11 < iVar8;
              local_2f0 = local_2f0 + 1) {
            TPZGeoMesh::ElementVec(local_2d8);
            ppTVar10 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                                 (in_stack_fffffffffffffac0,
                                  CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
            local_370 = *ppTVar10;
            if (local_370 != (TPZGeoEl *)0x0) {
              for (local_39c = 0; iVar4 = local_39c,
                  iVar5 = (**(code **)(*(long *)local_370 + 0x90))(), iVar4 < iVar5;
                  local_39c = local_39c + 1) {
                lVar11 = (**(code **)(*(long *)local_370 + 0xa8))(local_370,local_39c);
                if (lVar11 == local_398) {
                  (**(code **)(*(long *)local_370 + 0x178))(local_370,local_39c,local_390);
                }
              }
            }
          }
        }
      }
      local_3a8 = TPZGeoMesh::NElements((TPZGeoMesh *)0x1f20de4);
      for (local_2e0 = 0; local_2e0 < local_3a8; local_2e0 = local_2e0 + 1) {
        TPZGeoMesh::ElementVec(local_2d8);
        ppTVar10 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                             (in_stack_fffffffffffffac0,
                              CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
        local_370 = *ppTVar10;
        if (local_370 != (TPZGeoEl *)0x0) {
          TPZVec<long>::TPZVec(&local_3c8);
          iVar4 = (**(code **)(*(long *)local_370 + 0x90))();
          local_3d0 = (long)iVar4;
          uVar6 = (**(code **)(*(long *)local_370 + 0x90))();
          TPZVec<long>::Resize
                    ((TPZVec<long> *)CONCAT44(iVar4,uVar6),(int64_t)in_stack_fffffffffffffac8);
          for (local_2e8 = 0; (long)local_2e8 < local_3d0; local_2e8 = local_2e8 + 1) {
            in_stack_fffffffffffffac8 =
                 (TPZVec<double> *)
                 (**(code **)(*(long *)local_370 + 0xa8))(local_370,local_2e8 & 0xffffffff);
            in_stack_fffffffffffffac0 =
                 (TPZChunkVector<TPZGeoEl_*,_10> *)TPZVec<long>::operator[](&local_3c8,local_2e8);
            (in_stack_fffffffffffffac0->super_TPZSavable)._vptr_TPZSavable =
                 (_func_int **)in_stack_fffffffffffffac8;
          }
          bVar1 = *(byte *)(in_RDI + 0x47);
          pTVar13 = in_RSI;
          in_stack_fffffffffffffabc = (**(code **)(*(long *)local_370 + 0xb8))();
          uVar7 = TPZGeoEl::MaterialId(local_370);
          iVar4 = (*(pTVar13->super_TPZSavable)._vptr_TPZSavable[0xc])
                            (pTVar13,(ulong)in_stack_fffffffffffffabc,&local_3c8,(ulong)uVar7,
                             local_3d8,(ulong)((bVar1 & 1) != 0));
          in_stack_fffffffffffffaa0 = (TPZGeoMesh *)CONCAT44(extraout_var,iVar4);
          if (in_stack_fffffffffffffaa0 == (TPZGeoMesh *)0x0) {
            pzinternal::DebugStopImpl
                      ((char *)in_stack_fffffffffffffec0,(size_t)in_stack_fffffffffffffeb8);
          }
          TPZVec<long>::~TPZVec((TPZVec<long> *)in_stack_fffffffffffffaa0);
        }
      }
      TPZGeoMesh::ResetConnectivities(in_stack_fffffffffffffb30);
      TPZGeoMesh::BuildConnectivity(in_stack_fffffffffffffdc0);
      local_1 = true;
      TPZVec<double>::~TPZVec((TPZVec<double> *)in_stack_fffffffffffffaa0);
      TPZVec<double>::~TPZVec((TPZVec<double> *)in_stack_fffffffffffffaa0);
      TPZGeoMesh::~TPZGeoMesh((TPZGeoMesh *)0x1f210a7);
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool TPZGenGrid2D::ReadAndMergeGeoMesh(TPZGeoMesh* gridinitial, TPZGeoMesh* tomerge, int matid) {
    // gridinitial is created by TPZGenGrid2D current
    if (Read(gridinitial, matid))
        return false;
    if (!tomerge->NNodes() && !tomerge->NElements())
        return true;

    // Copy vectors for nodes and elements of the gridtomerge, then the original data is preserved
    TPZGeoMesh gtomerge(*tomerge);
    TPZGeoMesh *gridtomerge = &gtomerge;

    int64_t i, j, k, nnodestomerge = gridtomerge->NNodes();
    int64_t nnodesinitial = gridinitial->NNodes();
    //    int nneltomerge = gridtomerge->NElements();
    TPZVec<REAL> coordinitial(3, 0.);
    TPZVec<REAL> coordtomerge(3, 0.);
    TPZGeoNode *nodetomerge;
    TPZGeoEl *gel;
    // Verifing each node in gridtomerge if exist into the gridinitial (as same coordinates). It is inefficient.
    for (i = 0; i < nnodestomerge; i++) {
        nodetomerge = &(gridtomerge->NodeVec()[i]);
        if (!nodetomerge) continue;
        nodetomerge->GetCoordinates(coordtomerge);
        for (j = 0; j < nnodesinitial; j++) {
            gridinitial->NodeVec()[j].GetCoordinates(coordinitial);
            if (IsZero(Distance(coordtomerge, coordinitial))) {
                // In this case exists a node with same coordinates, then the id is update as id of the gridinitial with same coordinates
                // and the old id is stored in coord[0]
                nodetomerge->SetCoord(0, nodetomerge->Id());
                nodetomerge->SetNodeId(gridinitial->NodeVec()[j].Id());
                break;
            }
        }

        // If the node (i) not exists into the gridinitial is created a new node copy in this grid, and is substitutived in all the 
        // elements in gridinitial the id as old node with the id of the new node. At last the id of the node duplicated is put as -1
        if (j == nnodesinitial) {
            // resizing the vector of the nodes
            int64_t index = gridinitial->NodeVec().AllocateNewElement();
            gridinitial->NodeVec()[index].Initialize(coordtomerge, *gridinitial);
            index = gridinitial->NodeVec()[index].Id();
            int64_t oldid = nodetomerge->Id();
            for (k = 0; k < gridtomerge->NElements(); k++) {
                gel = gridtomerge->ElementVec()[k];
                if (!gel) continue;
                for (int p = 0; p < gel->NNodes(); p++)
                    if (gel->NodeIndex(p) == oldid)
                        gel->SetNodeIndex(p, index);
            }
            nodetomerge->SetNodeId(-1);
        }
    }

    // changing the id of the repeated nodes into the geometric elements of the gridtomerge
    for (i = 0; i < nnodestomerge; i++) {
        nodetomerge = &(gridtomerge->NodeVec()[i]);
        if (!nodetomerge || nodetomerge->Id() == -1) continue;
        int64_t idnew = nodetomerge->Id(), idold = (int64_t) (nodetomerge->Coord(0));
        for (k = 0; k < gridtomerge->NElements(); k++) {
            gel = gridtomerge->ElementVec()[k];
            if (!gel) continue;
            for (int p = 0; p < gel->NNodes(); p++)
                if (gel->NodeIndex(p) == idold)
                    gel->SetNodeIndex(p, idnew);
        }
    }

    // creating new element into gridinitial corresponding for each element in gridtomerge
    int64_t nelmerge = gridtomerge->NElements();
    for (i = 0; i < nelmerge; i++) {
        gel = gridtomerge->ElementVec()[i];
        if (!gel) continue;
        TPZVec<int64_t> nos;
        int64_t ngelnodes = gel->NNodes(), index;
        nos.Resize(gel->NNodes());
        for (j = 0; j < ngelnodes; j++)
            nos[j] = gel->NodeIndex(j);
        int eltype = 1;
        if (fRefPattern == false) {
            eltype = 0;
        }

        if (!gridinitial->CreateGeoElement(gel->Type(), nos, gel->MaterialId(), index, eltype))
            DebugStop();
    }

    // computing the connectivity
    gridinitial->ResetConnectivities();
    gridinitial->BuildConnectivity();
    return true;
}